

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

TPZFMatrix<Fad<long_double>_> * __thiscall
TPZFMatrix<Fad<long_double>_>::NewMatrix(TPZFMatrix<Fad<long_double>_> *this)

{
  TPZFMatrix<Fad<long_double>_> *this_00;
  
  this_00 = (TPZFMatrix<Fad<long_double>_> *)operator_new(0x90);
  TPZFMatrix(this_00);
  return this_00;
}

Assistant:

inline TPZFMatrix<TVar>*NewMatrix() const override {return new TPZFMatrix<TVar>{};}